

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  int iVar1;
  Mat MStack_58;
  
  (**mb->_vptr_ModelBin)(&MStack_58,mb,(ulong)(uint)this->scale_data_size,1);
  Mat::operator=(&this->scale_data,&MStack_58);
  Mat::~Mat(&MStack_58);
  if (((this->scale_data).data == (void *)0x0) ||
     (iVar1 = 0, (long)(this->scale_data).c * (this->scale_data).cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}